

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RestraintForceModifier.cpp
# Opt level: O2

RealType __thiscall
OpenMD::RestraintForceModifier::doRestraints(RestraintForceModifier *this,RealType scalingFactor)

{
  double dVar1;
  Molecule *propName;
  long lVar2;
  pointer ppMVar3;
  long lVar4;
  ObjectRestraint *this_00;
  pointer ppSVar5;
  StuntDouble *pSVar6;
  long lVar7;
  shared_ptr<OpenMD::GenericData> data;
  Vector3d molCom;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> forces;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> struc;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::Restraint_*>_> restData;
  map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  restInfo;
  MolecularRestraint *local_1d0;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_1b8;
  vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
  *local_1a8;
  undefined1 local_1a0 [24];
  _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_188;
  Vector<double,_3U> local_168;
  RectMatrix<double,_3U,_3U> local_150;
  _Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_108;
  _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
  local_f0;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  local_1b8._M_ptr = (element_type *)0x0;
  local_1b8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f0._M_impl.super__Rb_tree_header._M_header;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f0._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->unscaledPotential_ = 0.0;
  local_1a8 = &this->restInfo_;
  local_f0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
  ::clear(local_1a8);
  ppMVar3 = (this->restrainedMols_).
            super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_1d0 = (MolecularRestraint *)0x0;
LAB_001fe294:
  if (ppMVar3 !=
      (this->restrainedMols_).
      super__Vector_base<OpenMD::Molecule_*,_std::allocator<OpenMD::Molecule_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    propName = *ppMVar3;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"Restraint",(allocator<char> *)&local_168);
    Molecule::getPropertyByName((Molecule *)local_1a0,(string *)propName);
    std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_1b8,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_1a0
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a0 + 8));
    std::__cxx11::string::~string((string *)&local_150);
    if (local_1b8._M_ptr == (element_type *)0x0) {
      builtin_strncpy(painCave.errMsg + 0x23,"edObject\n",10);
      builtin_strncpy(painCave.errMsg + 0x10,"traint for Restrain",0x13);
      builtin_strncpy(painCave.errMsg,"Can not find Res",0x10);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      goto LAB_001fe43f;
    }
    std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::Restraint*>,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)&local_150);
    if ((pointer)local_150.data_[0][0] == (pointer)0x0) {
      builtin_strncpy(painCave.errMsg + 0x23,"ntData\n",8);
      builtin_strncpy(painCave.errMsg + 0x10,"ericData to Restrai",0x13);
      builtin_strncpy(painCave.errMsg,"Can not cast Gen",0x10);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      if (*(pointer)((long)local_150.data_[0][0] + 0x28) != (Bend *)0x0) {
        local_1d0 = (MolecularRestraint *)
                    __dynamic_cast(*(pointer)((long)local_150.data_[0][0] + 0x28),
                                   &Restraint::typeinfo,&MolecularRestraint::typeinfo,0);
        if (local_1d0 != (MolecularRestraint *)0x0) goto LAB_001fe432;
      }
      builtin_strncpy(painCave.errMsg,"Can not cast RestraintData to MolecularRestraint\n",0x32);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
      local_1d0 = (MolecularRestraint *)0x0;
    }
LAB_001fe432:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150.data_[0] + 1));
LAB_001fe43f:
    Molecule::getCom((Vector3d *)local_1a0,*ppMVar3);
    local_168.data_[0] = 0.0;
    local_168.data_[1] = 0.0;
    local_168.data_[2] = 0.0;
    local_188._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_188._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_188._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppSVar5 = ((*ppMVar3)->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar5 !=
        ((*ppMVar3)->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001fe4ab;
    pSVar6 = (StuntDouble *)0x0;
    while (pSVar6 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_150,pSVar6);
      std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
      emplace_back<OpenMD::Vector3<double>>
                ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                 &local_168,(Vector3<double> *)&local_150);
      ppSVar5 = ppSVar5 + 1;
      pSVar6 = (StuntDouble *)0x0;
      if (ppSVar5 !=
          ((*ppMVar3)->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001fe4ab:
        pSVar6 = *ppSVar5;
      }
    }
    (local_1d0->super_Restraint).scaleFactor_ = scalingFactor;
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               &local_108,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               &local_168);
    Vector<double,_3U>::Vector(&local_90,(Vector<double,_3U> *)local_1a0);
    MolecularRestraint::calcForce
              (local_1d0,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               &local_108,(Vector3d *)&local_90);
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base(&local_108);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               &local_150,&local_1d0->forces_);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::_M_move_assign
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               &local_188,&local_150);
    std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
    ~_Vector_base((_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   *)&local_150);
    ppSVar5 = ((*ppMVar3)->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    pSVar6 = (StuntDouble *)0x0;
    lVar2 = 0;
    if (ppSVar5 !=
        ((*ppMVar3)->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001fe5b5;
    do {
      lVar7 = lVar4 * 0x18;
      do {
        if (pSVar6 == (StuntDouble *)0x0) {
          this->unscaledPotential_ = (local_1d0->super_Restraint).pot_ + this->unscaledPotential_;
          if ((local_1d0->super_Restraint).printRest_ == true) {
            std::
            _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
            ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                        *)&local_150,&(local_1d0->super_Restraint).restInfo_._M_t);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
            ::operator=(&local_f0,
                        (_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                         *)&local_150);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
            ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                         *)&local_150);
            std::
            vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
            ::push_back(local_1a8,(value_type *)&local_f0);
          }
          std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          ~_Vector_base(&local_188);
          std::_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          ~_Vector_base((_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)&local_168);
          ppMVar3 = ppMVar3 + 1;
          goto LAB_001fe294;
        }
        StuntDouble::addFrc(pSVar6,(Vector3d *)
                                   ((long)((local_188._M_impl.super__Vector_impl_data._M_start)->
                                          super_Vector<double,_3U>).data_ + lVar7));
        StuntDouble::getPos((Vector3d *)&local_150,pSVar6);
        std::vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>>::
        emplace_back<OpenMD::Vector3<double>>
                  ((vector<OpenMD::Vector3<double>,std::allocator<OpenMD::Vector3<double>>> *)
                   &local_168,(Vector3<double> *)&local_150);
        lVar4 = lVar4 + 1;
        ppSVar5 = ppSVar5 + 1;
        lVar7 = lVar7 + 0x18;
        pSVar6 = (StuntDouble *)0x0;
        lVar2 = lVar4;
      } while (ppSVar5 ==
               ((*ppMVar3)->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
LAB_001fe5b5:
      lVar4 = lVar2;
      pSVar6 = *ppSVar5;
    } while( true );
  }
  ppSVar5 = (this->restrainedObjs_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_00 = (ObjectRestraint *)0x0;
  do {
    if (ppSVar5 ==
        (this->restrainedObjs_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      dVar1 = this->unscaledPotential_;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::~_Rb_tree(&local_f0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b8._M_refcount);
      return scalingFactor * dVar1;
    }
    pSVar6 = *ppSVar5;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"Restraint",(allocator<char> *)&local_168);
    StuntDouble::getPropertyByName((StuntDouble *)local_1a0,(string *)pSVar6);
    std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_1b8,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_1a0
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a0 + 8));
    std::__cxx11::string::~string((string *)&local_150);
    if (local_1b8._M_ptr == (element_type *)0x0) {
      builtin_strncpy(painCave.errMsg + 0x23,"edObject\n",10);
      builtin_strncpy(painCave.errMsg + 0x10,"traint for Restrain",0x13);
      builtin_strncpy(painCave.errMsg,"Can not find Res",0x10);
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    else {
      std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::Restraint*>,OpenMD::GenericData>
                ((shared_ptr<OpenMD::GenericData> *)&local_150);
      if ((pointer)local_150.data_[0][0] == (pointer)0x0) {
        builtin_strncpy(painCave.errMsg + 0x23,"ntData\n",8);
        builtin_strncpy(painCave.errMsg + 0x10,"ericData to Restrai",0x13);
        builtin_strncpy(painCave.errMsg,"Can not cast Gen",0x10);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      else {
        if (*(pointer)((long)local_150.data_[0][0] + 0x28) != (Bend *)0x0) {
          this_00 = (ObjectRestraint *)
                    __dynamic_cast(*(pointer)((long)local_150.data_[0][0] + 0x28),
                                   &Restraint::typeinfo,&ObjectRestraint::typeinfo,0);
          if (this_00 != (ObjectRestraint *)0x0) goto LAB_001fe7d7;
        }
        builtin_strncpy(painCave.errMsg + 0x23,"tRestraint\n",0xc);
        builtin_strncpy(painCave.errMsg + 0x10,"traintData to Objec",0x13);
        builtin_strncpy(painCave.errMsg,"Can not cast Res",0x10);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
        this_00 = (ObjectRestraint *)0x0;
      }
LAB_001fe7d7:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_150.data_[0] + 1));
    }
    (this_00->super_Restraint).scaleFactor_ = scalingFactor;
    StuntDouble::getPos((Vector3d *)local_1a0,*ppSVar5);
    if ((*ppSVar5)->objType_ - otDAtom < 2) {
      StuntDouble::getA((RotMat3x3d *)&local_150,*ppSVar5);
      Vector<double,_3U>::Vector(&local_a8,(Vector<double,_3U> *)local_1a0);
      RectMatrix<double,_3U,_3U>::operator=(&local_78,&local_150);
      ObjectRestraint::calcForce(this_00,(Vector3d *)&local_a8,(RotMat3x3d *)&local_78);
      pSVar6 = *ppSVar5;
      Vector<double,_3U>::Vector(&local_168,&(this_00->force_).super_Vector<double,_3U>);
      StuntDouble::addFrc(pSVar6,(Vector3d *)&local_168);
      pSVar6 = *ppSVar5;
      Vector<double,_3U>::Vector(&local_168,&(this_00->torque_).super_Vector<double,_3U>);
      StuntDouble::addTrq(pSVar6,(Vector3d *)&local_168);
    }
    else {
      Vector<double,_3U>::Vector(&local_c0,(Vector<double,_3U> *)local_1a0);
      ObjectRestraint::calcForce(this_00,(Vector3d *)&local_c0);
      pSVar6 = *ppSVar5;
      Vector<double,_3U>::Vector
                ((Vector<double,_3U> *)&local_150,&(this_00->force_).super_Vector<double,_3U>);
      StuntDouble::addFrc(pSVar6,(Vector3d *)&local_150);
    }
    this->unscaledPotential_ = (this_00->super_Restraint).pot_ + this->unscaledPotential_;
    if ((this_00->super_Restraint).printRest_ == true) {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                  *)&local_150,&(this_00->super_Restraint).restInfo_._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::operator=(&local_f0,
                  (_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                   *)&local_150);
      std::
      _Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_std::pair<double,_double>_>,_std::_Select1st<std::pair<const_int,_std::pair<double,_double>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                   *)&local_150);
      std::
      vector<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>,_std::allocator<std::map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>_>_>
      ::push_back(local_1a8,(value_type *)&local_f0);
    }
    ppSVar5 = ppSVar5 + 1;
  } while( true );
}

Assistant:

RealType RestraintForceModifier::doRestraints(RealType scalingFactor) {
    std::vector<Molecule*>::const_iterator rm;
    std::shared_ptr<GenericData> data;
    Molecule::IntegrableObjectIterator ioi;
    MolecularRestraint* mRest = NULL;
    ObjectRestraint* oRest    = NULL;
    StuntDouble* sd;

    std::vector<StuntDouble*>::const_iterator ro;

    std::map<int, Restraint::RealPair> restInfo;

    unscaledPotential_ = 0.0;

    restInfo_.clear();

    for (rm = restrainedMols_.begin(); rm != restrainedMols_.end(); ++rm) {
      // make sure this molecule (*rm) has a generic data for restraints:
      data = (*rm)->getPropertyByName("Restraint");
      if (data != nullptr) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a
          // MolecularRestraint
          mRest = dynamic_cast<MolecularRestraint*>(restData->getData());
          if (mRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to MolecularRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not cast GenericData to RestraintData\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Restraint for RestrainedObject\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      // phew.  At this point, we should have the pointer to the
      // correct MolecularRestraint in the variable mRest.

      Vector3d molCom = (*rm)->getCom();

      std::vector<Vector3d> struc;
      std::vector<Vector3d> forces;

      for (sd = (*rm)->beginIntegrableObject(ioi); sd != NULL;
           sd = (*rm)->nextIntegrableObject(ioi)) {
        struc.push_back(sd->getPos());
      }

      mRest->setScaleFactor(scalingFactor);
      mRest->calcForce(struc, molCom);
      forces    = mRest->getRestraintForces();
      int index = 0;

      for (sd = (*rm)->beginIntegrableObject(ioi); sd != NULL;
           sd = (*rm)->nextIntegrableObject(ioi)) {
        sd->addFrc(forces[index]);
        struc.push_back(sd->getPos());
        index++;
      }

      unscaledPotential_ += mRest->getUnscaledPotential();

      // only collect data on restraints that we're going to print:
      if (mRest->getPrintRestraint()) {
        restInfo = mRest->getRestraintInfo();
        restInfo_.push_back(restInfo);
      }
    }

    for (ro = restrainedObjs_.begin(); ro != restrainedObjs_.end(); ++ro) {
      // make sure this object (*ro) has a generic data for restraints:
      data = (*ro)->getPropertyByName("Restraint");
      if (data != NULL) {
        // make sure we can reinterpret the generic data as restraint data:
        std::shared_ptr<RestraintData> restData =
            std::dynamic_pointer_cast<RestraintData>(data);
        if (restData != nullptr) {
          // make sure we can reinterpet the restraint data as a pointer to
          // an ObjectRestraint:
          oRest = dynamic_cast<ObjectRestraint*>(restData->getData());
          if (oRest == NULL) {
            snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                     "Can not cast RestraintData to ObjectRestraint\n");
            painCave.severity = OPENMD_ERROR;
            painCave.isFatal  = 1;
            simError();
          }
        } else {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "Can not cast GenericData to RestraintData\n");
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Can not find Restraint for RestrainedObject\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }

      // phew.  At this point, we should have the pointer to the
      // correct Object restraint in the variable oRest.
      oRest->setScaleFactor(scalingFactor);

      Vector3d pos = (*ro)->getPos();

      if ((*ro)->isDirectional()) {
        // directional objects may have orientational restraints as well
        // as positional, so get the rotation matrix first:

        RotMat3x3d A = (*ro)->getA();
        oRest->calcForce(pos, A);
        (*ro)->addFrc(oRest->getRestraintForce());
        (*ro)->addTrq(oRest->getRestraintTorque());

      } else {
        // plain vanilla positional restraints:

        oRest->calcForce(pos);
        (*ro)->addFrc(oRest->getRestraintForce());
      }

      unscaledPotential_ += oRest->getUnscaledPotential();

      // only collect data on restraints that we're going to print:
      if (oRest->getPrintRestraint()) {
        restInfo = oRest->getRestraintInfo();
        restInfo_.push_back(restInfo);
      }
    }

    return unscaledPotential_ * scalingFactor;
  }